

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_code_options.c
# Opt level: O0

int check_uncompressed(test_state *state)

{
  int iVar1;
  uchar *puStack_28;
  int size;
  uchar *tmp;
  int status;
  test_state *state_local;
  
  iVar1 = state->bytes_per_sample;
  for (puStack_28 = state->ubuf; puStack_28 < state->ubuf + state->buf_len;
      puStack_28 = puStack_28 + (iVar1 << 1)) {
    (*state->out)(puStack_28,state->xmax,iVar1);
    (*state->out)(puStack_28 + iVar1,state->xmin,iVar1);
  }
  printf("Checking uncompressed ... ");
  state_local._4_4_ =
       check_block_sizes(state,(int)(1L << ((byte)state->id_len & 0x3f)) + -1,state->id_len);
  if (state_local._4_4_ == 0) {
    printf("%s\n","\x1b[0;32mPASS\x1b[0m");
    state_local._4_4_ = 0;
  }
  return state_local._4_4_;
}

Assistant:

int check_uncompressed(struct test_state *state)
{
    int status;
    unsigned char *tmp;

    int size = state->bytes_per_sample;

    for (tmp = state->ubuf;
         tmp < state->ubuf + state->buf_len;
         tmp += 2 * size) {
        state->out(tmp, state->xmax, size);
        state->out(tmp + size, state->xmin, size);
    }

    printf("Checking uncompressed ... ");
    status = check_block_sizes(state,
                               (1ULL << state->id_len) - 1,
                               state->id_len);
    if (status)
        return status;

    printf ("%s\n", CHECK_PASS);
    return 0;
}